

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int quicly_send_stream(quicly_stream_t *stream,quicly_send_context_t *s)

{
  int iVar1;
  quicly_sent_t *pqVar2;
  quicly_sent_t **in_RSI;
  long *in_RDI;
  size_t len_of_len;
  size_t emit_off;
  uint64_t range_capacity;
  size_t max_stream_data;
  uint64_t new_bytes;
  uint8_t *hp;
  uint8_t header [18];
  int is_fin;
  int wrote_all;
  int ret;
  size_t len;
  size_t capacity;
  uint8_t *frame_type_at;
  quicly_sent_t *sent;
  uint64_t end_off;
  uint64_t off;
  quicly_sent_acked_cb in_stack_ffffffffffffff58;
  quicly_sent_t **in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  quicly_send_context_t *in_stack_ffffffffffffff70;
  quicly_conn_t *in_stack_ffffffffffffff78;
  uint8_t *local_70;
  byte local_68 [20];
  int local_54;
  int local_50;
  int local_4c;
  quicly_conn_t *local_48;
  quicly_conn_t *local_40;
  quicly_sent_t *local_38;
  long local_30;
  uint8_t *local_28;
  uint8_t *local_20;
  quicly_sent_t **local_18;
  long *local_10;
  int local_4;
  
  local_20 = *(uint8_t **)in_RDI[8];
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (in_RDI[1] < 0) {
    in_stack_ffffffffffffff58 = (quicly_sent_acked_cb)*in_RDI;
    quicly_encodev_capacity((uint64_t)local_20);
    local_4c = allocate_ack_eliciting_frame
                         (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                          in_stack_ffffffffffffff68,in_RSI,in_stack_ffffffffffffff58);
    if (local_4c != 0) {
      return local_4c;
    }
    local_38 = (quicly_sent_t *)0x0;
    pqVar2 = local_18[0xb];
    local_18[0xb] = (quicly_sent_t *)((long)&pqVar2->acked + 1);
    *(undefined1 *)&pqVar2->acked = 6;
    pqVar2 = (quicly_sent_t *)
             ptls_encode_quicint((uint8_t *)in_RSI,(uint64_t)in_stack_ffffffffffffff58);
    local_18[0xb] = pqVar2;
    local_40 = (quicly_conn_t *)((long)local_18[0xc] - (long)local_18[0xb]);
  }
  else {
    local_70 = ptls_encode_quicint((uint8_t *)in_stack_ffffffffffffff60,
                                   (uint64_t)in_stack_ffffffffffffff58);
    if (local_20 == (uint8_t *)0x0) {
      local_68[0] = 8;
      in_RSI = in_stack_ffffffffffffff60;
    }
    else {
      local_68[0] = 0xc;
      local_70 = ptls_encode_quicint((uint8_t *)in_stack_ffffffffffffff60,
                                     (uint64_t)in_stack_ffffffffffffff58);
      in_RSI = in_stack_ffffffffffffff60;
    }
    iVar1 = quicly_sendstate_is_open((quicly_sendstate_t *)(local_10 + 3));
    if ((iVar1 == 0) && (local_20 == (undefined1 *)local_10[0xe])) {
      local_68[0] = local_68[0] | 1;
      local_4c = allocate_ack_eliciting_frame
                           (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                            in_stack_ffffffffffffff68,in_RSI,in_stack_ffffffffffffff58);
      if (local_4c != 0) {
        return local_4c;
      }
      if ((long)local_70 - (long)local_68 != (long)local_18[0xc] - (long)local_18[0xb]) {
        local_68[0] = local_68[0] | 2;
        *local_70 = '\0';
        local_70 = local_70 + 1;
      }
      memcpy(local_18[0xb],local_68,(long)local_70 - (long)local_68);
      local_18[0xb] = (quicly_sent_t *)(((long)local_70 - (long)local_68) + (long)local_18[0xb]);
      local_28 = local_20;
      local_50 = 1;
      local_54 = 1;
      goto LAB_0014325c;
    }
    local_4c = allocate_ack_eliciting_frame
                         (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                          in_stack_ffffffffffffff68,in_RSI,in_stack_ffffffffffffff58);
    if (local_4c != 0) {
      return local_4c;
    }
    local_38 = local_18[0xb];
    memcpy(local_18[0xb],local_68,(long)local_70 - (long)local_68);
    local_18[0xb] = (quicly_sent_t *)(((long)local_70 - (long)local_68) + (long)local_18[0xb]);
    local_40 = (quicly_conn_t *)((long)local_18[0xc] - (long)local_18[0xb]);
    if ((undefined1 *)local_10[0x18] <
        (local_40->super).local.cid_set.cids[0].cid.cid + ((long)local_20 - 0x30)) {
      local_40 = (quicly_conn_t *)(local_10[0x18] - (long)local_20);
    }
    if (((undefined1 *)local_10[0xd] <
         (local_40->super).local.cid_set.cids[0].cid.cid + ((long)local_20 - 0x30)) &&
       ((ulong)(*(long *)(*local_10 + 0x690) - *(long *)(*local_10 + 0x698)) <
        (ulong)((long)local_40 + ((long)local_20 - local_10[0xd])))) {
      local_40 = (quicly_conn_t *)
                 (((local_10[0xd] + *(long *)(*local_10 + 0x690)) - *(long *)(*local_10 + 0x698)) -
                 (long)local_20);
    }
  }
  in_stack_ffffffffffffff78 = (quicly_conn_t *)(*(long *)(local_10[8] + 8) - (long)local_20);
  iVar1 = quicly_sendstate_is_open((quicly_sendstate_t *)(local_10 + 3));
  if ((iVar1 == 0) &&
     ((undefined1 *)local_10[0xe] <
      (in_stack_ffffffffffffff78->super).local.cid_set.cids[0].cid.cid + ((long)local_20 - 0x30))) {
    if (in_stack_ffffffffffffff78 < (quicly_conn_t *)0x2) {
      __assert_fail("range_capacity > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                    ,0xda6,"int quicly_send_stream(quicly_stream_t *, quicly_send_context_t *)");
    }
    in_stack_ffffffffffffff78 =
         (quicly_conn_t *)
         ((long)&in_stack_ffffffffffffff78[-1].stash.on_ack_stream.active_acked_cache.args.end + 7);
  }
  if (in_stack_ffffffffffffff78 < local_40) {
    local_40 = in_stack_ffffffffffffff78;
  }
  if (local_40 == (quicly_conn_t *)0x0) {
    __assert_fail("capacity != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                  ,0xdae,"int quicly_send_stream(quicly_stream_t *, quicly_send_context_t *)");
  }
  local_48 = local_40;
  in_stack_ffffffffffffff70 = (quicly_send_context_t *)(local_20 + -*(long *)(local_10[3] + 8));
  (**(code **)(local_10[2] + 0x10))
            (local_10,in_stack_ffffffffffffff70,local_18[0xb],&local_48,&local_50);
  if (2 < *(uint *)(*local_10 + 8)) {
    return 0xff06;
  }
  if ((int)local_10[0x1a] != 0) {
    return 0;
  }
  if (local_40 < local_48) {
    __assert_fail("len <= capacity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                  ,0xdb8,"int quicly_send_stream(quicly_stream_t *, quicly_send_context_t *)");
  }
  if (local_48 == (quicly_conn_t *)0x0) {
    __assert_fail("len != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                  ,0xdb9,"int quicly_send_stream(quicly_stream_t *, quicly_send_context_t *)");
  }
  if ((local_38 == (quicly_sent_t *)0x0) ||
     (local_48 < (quicly_conn_t *)((long)local_18[0xc] - (long)local_18[0xb]))) {
    if (local_38 != (quicly_sent_t *)0x0) {
      *(byte *)&local_38->acked = *(byte *)&local_38->acked | 2;
    }
    in_stack_ffffffffffffff68 = quicly_encodev_capacity((uint64_t)local_48);
    if ((undefined1 *)((long)local_18[0xc] - (long)local_18[0xb]) <
        (local_48->super).local.cid_set.cids[0].cid.cid + (in_stack_ffffffffffffff68 - 0x30)) {
      local_48 = (quicly_conn_t *)
                 ((long)local_18[0xc] + (-in_stack_ffffffffffffff68 - (long)local_18[0xb]));
      local_50 = 0;
    }
    memmove((void *)((long)&local_18[0xb]->acked + in_stack_ffffffffffffff68),local_18[0xb],
            (size_t)local_48);
    pqVar2 = (quicly_sent_t *)
             ptls_encode_quicint((uint8_t *)in_RSI,(uint64_t)in_stack_ffffffffffffff58);
    local_18[0xb] = pqVar2;
  }
  local_18[0xb] = (quicly_sent_t *)((long)&local_18[0xb]->acked + (long)&local_48->super);
  local_28 = (local_48->super).local.cid_set.cids[0].cid.cid + ((long)local_20 - 0x30);
  iVar1 = quicly_sendstate_is_open((quicly_sendstate_t *)(local_10 + 3));
  if ((iVar1 == 0) && (local_28 == (undefined1 *)local_10[0xe])) {
    if (local_38 == (quicly_sent_t *)0x0) {
      __assert_fail("frame_type_at != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                    ,0xdcc,"int quicly_send_stream(quicly_stream_t *, quicly_send_context_t *)");
    }
    local_54 = 1;
    *(byte *)&local_38->acked = *(byte *)&local_38->acked | 1;
  }
  else {
    local_54 = 0;
  }
LAB_0014325c:
  if (local_10[1] < 0) {
    *(long *)(*local_10 + 0x3b0) = *(long *)(*local_10 + 0x3b0) + 1;
  }
  else {
    *(long *)(*local_10 + 0x3c0) = *(long *)(*local_10 + 0x3c0) + 1;
  }
  if ((undefined1 *)local_10[0xd] < local_28) {
    if (-1 < local_10[1]) {
      *(long *)(*local_10 + 0x698) = (long)local_28 + (*(long *)(*local_10 + 0x698) - local_10[0xd])
      ;
    }
    local_10[0xd] = (long)local_28;
  }
  local_4c = quicly_ranges_subtract
                       ((quicly_ranges_t *)in_stack_ffffffffffffff78,
                        (uint64_t)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  local_4 = local_4c;
  if ((local_4c == 0) &&
     ((local_50 == 0 ||
      (local_4 = quicly_ranges_subtract
                           ((quicly_ranges_t *)in_stack_ffffffffffffff78,
                            (uint64_t)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68),
      local_4 == 0)))) {
    *(long *)(local_30 + 8) = local_10[1];
    *(uint8_t **)(local_30 + 0x10) = local_20;
    *(uint8_t **)(local_30 + 0x18) = local_28 + local_54;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int quicly_send_stream(quicly_stream_t *stream, quicly_send_context_t *s)
{
    uint64_t off = stream->sendstate.pending.ranges[0].start, end_off;
    quicly_sent_t *sent;
    uint8_t *frame_type_at;
    size_t capacity, len;
    int ret, wrote_all, is_fin;

    /* write frame type, stream_id and offset, calculate capacity */
    if (stream->stream_id < 0) {
        if ((ret = allocate_ack_eliciting_frame(stream->conn, s,
                                                1 + quicly_encodev_capacity(off) + 2 /* type + len + offset + 1-byte payload */,
                                                &sent, on_ack_stream)) != 0)
            return ret;
        frame_type_at = NULL;
        *s->dst++ = QUICLY_FRAME_TYPE_CRYPTO;
        s->dst = quicly_encodev(s->dst, off);
        capacity = s->dst_end - s->dst;
    } else {
        uint8_t header[18], *hp = header + 1;
        hp = quicly_encodev(hp, stream->stream_id);
        if (off != 0) {
            header[0] = QUICLY_FRAME_TYPE_STREAM_BASE | QUICLY_FRAME_TYPE_STREAM_BIT_OFF;
            hp = quicly_encodev(hp, off);
        } else {
            header[0] = QUICLY_FRAME_TYPE_STREAM_BASE;
        }
        if (!quicly_sendstate_is_open(&stream->sendstate) && off == stream->sendstate.final_size) {
            /* special case for emitting FIN only */
            header[0] |= QUICLY_FRAME_TYPE_STREAM_BIT_FIN;
            if ((ret = allocate_ack_eliciting_frame(stream->conn, s, hp - header, &sent, on_ack_stream)) != 0)
                return ret;
            if (hp - header != s->dst_end - s->dst) {
                header[0] |= QUICLY_FRAME_TYPE_STREAM_BIT_LEN;
                *hp++ = 0; /* empty length */
            }
            memcpy(s->dst, header, hp - header);
            s->dst += hp - header;
            end_off = off;
            wrote_all = 1;
            is_fin = 1;
            goto UpdateState;
        }
        if ((ret = allocate_ack_eliciting_frame(stream->conn, s, hp - header + 1, &sent, on_ack_stream)) != 0)
            return ret;
        frame_type_at = s->dst;
        memcpy(s->dst, header, hp - header);
        s->dst += hp - header;
        capacity = s->dst_end - s->dst;
        /* cap by max_stream_data */
        if (off + capacity > stream->_send_aux.max_stream_data)
            capacity = stream->_send_aux.max_stream_data - off;
        /* cap by max_data */
        if (off + capacity > stream->sendstate.size_inflight) {
            uint64_t new_bytes = off + capacity - stream->sendstate.size_inflight;
            if (new_bytes > stream->conn->egress.max_data.permitted - stream->conn->egress.max_data.sent) {
                size_t max_stream_data =
                    stream->sendstate.size_inflight + stream->conn->egress.max_data.permitted - stream->conn->egress.max_data.sent;
                capacity = max_stream_data - off;
            }
        }
    }
    { /* cap the capacity to the current range */
        uint64_t range_capacity = stream->sendstate.pending.ranges[0].end - off;
        if (!quicly_sendstate_is_open(&stream->sendstate) && off + range_capacity > stream->sendstate.final_size) {
            assert(range_capacity > 1); /* see the special case above */
            range_capacity -= 1;
        }
        if (capacity > range_capacity)
            capacity = range_capacity;
    }

    /* write payload */
    assert(capacity != 0);
    len = capacity;
    size_t emit_off = (size_t)(off - stream->sendstate.acked.ranges[0].end);
    QUICLY_PROBE(STREAM_ON_SEND_EMIT, stream->conn, stream->conn->stash.now, stream, emit_off, len);
    stream->callbacks->on_send_emit(stream, emit_off, s->dst, &len, &wrote_all);
    if (stream->conn->super.state >= QUICLY_STATE_CLOSING) {
        return QUICLY_ERROR_IS_CLOSING;
    } else if (stream->_send_aux.reset_stream.sender_state != QUICLY_SENDER_STATE_NONE) {
        return 0;
    }
    assert(len <= capacity);
    assert(len != 0);

    /* update s->dst, insert length if necessary */
    if (frame_type_at == NULL || len < s->dst_end - s->dst) {
        if (frame_type_at != NULL)
            *frame_type_at |= QUICLY_FRAME_TYPE_STREAM_BIT_LEN;
        size_t len_of_len = quicly_encodev_capacity(len);
        if (len_of_len + len > s->dst_end - s->dst) {
            len = s->dst_end - s->dst - len_of_len;
            wrote_all = 0;
        }
        memmove(s->dst + len_of_len, s->dst, len);
        s->dst = quicly_encodev(s->dst, len);
    }
    s->dst += len;
    end_off = off + len;

    /* determine if the frame incorporates FIN */
    if (!quicly_sendstate_is_open(&stream->sendstate) && end_off == stream->sendstate.final_size) {
        assert(frame_type_at != NULL);
        is_fin = 1;
        *frame_type_at |= QUICLY_FRAME_TYPE_STREAM_BIT_FIN;
    } else {
        is_fin = 0;
    }

UpdateState:
    if (stream->stream_id < 0) {
        ++stream->conn->super.stats.num_frames_sent.crypto;
    } else {
        ++stream->conn->super.stats.num_frames_sent.stream;
    }
    QUICLY_PROBE(STREAM_SEND, stream->conn, stream->conn->stash.now, stream, off, end_off - off, is_fin);
    QUICLY_PROBE(QUICTRACE_SEND_STREAM, stream->conn, stream->conn->stash.now, stream, off, end_off - off, is_fin);
    /* update sendstate (and also MAX_DATA counter) */
    if (stream->sendstate.size_inflight < end_off) {
        if (stream->stream_id >= 0)
            stream->conn->egress.max_data.sent += end_off - stream->sendstate.size_inflight;
        stream->sendstate.size_inflight = end_off;
    }
    if ((ret = quicly_ranges_subtract(&stream->sendstate.pending, off, end_off + is_fin)) != 0)
        return ret;
    if (wrote_all) {
        if ((ret = quicly_ranges_subtract(&stream->sendstate.pending, stream->sendstate.size_inflight, UINT64_MAX)) != 0)
            return ret;
    }

    /* setup sentmap */
    sent->data.stream.stream_id = stream->stream_id;
    sent->data.stream.args.start = off;
    sent->data.stream.args.end = end_off + is_fin;

    return 0;
}